

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_example1.c
# Opt level: O1

int main(void)

{
  uint *puVar1;
  long lVar2;
  _Bool _Var3;
  uint uVar4;
  roaring_bitmap_t *r;
  uint64_t uVar5;
  size_t sVar6;
  size_t sVar7;
  roaring_bitmap_t *prVar8;
  roaring_bitmap_t *prVar9;
  uint32_t *puVar10;
  roaring_bitmap_t *prVar11;
  roaring_bitmap_t *r2;
  roaring_uint32_iterator_t *prVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t i;
  uint32_t uVar15;
  char *pcVar16;
  char *reason_failure;
  char *reason;
  uint32_t somevalues [3];
  roaring_bitmap_t *allmybitmaps [3];
  uint32_t buffer [256];
  int local_4ac;
  roaring_bitmap_t *local_4a8;
  roaring_bitmap_t *local_4a0;
  char *local_498;
  char *local_490;
  uint32_t local_488 [4];
  roaring_bitmap_t *local_478;
  roaring_bitmap_t *local_470;
  roaring_bitmap_t *local_468;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  uint32_t local_438 [258];
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar13 = (ulong)puVar1[3];
  uVar4 = *puVar1 >> 4;
  if (uVar4 < 0x406c) {
    if (uVar4 < 0x2065) {
      if (uVar4 < 0x266) {
        if (uVar4 < 0x6d) {
          uVar13 = (ulong)(uVar4 - 99);
          if (uVar4 - 99 < 2) {
            pcVar16 = "Prescott";
            goto LAB_001029ff;
          }
          if (uVar4 == 0x66) {
            pcVar16 = "Presler";
            goto LAB_001029ff;
          }
        }
        else {
          if (uVar4 == 0x6d) {
            pcVar16 = "Dothan";
            goto LAB_001029ff;
          }
          if (uVar4 == 0x6f) goto switchD_001027ac_caseD_0;
          if (uVar4 == 0x16c) {
            pcVar16 = "Pineview";
            goto LAB_001029ff;
          }
        }
      }
      else {
        uVar14 = (ulong)(uVar4 - 0x1066);
        if (uVar4 - 0x1066 < 9) {
          uVar13 = (long)&switchD_001027ac::switchdataD_00126004 +
                   (long)(int)(&switchD_001027ac::switchdataD_00126004)[uVar14];
          switch(uVar14) {
          case 0:
switchD_001027ac_caseD_0:
            pcVar16 = "Merom";
            goto LAB_001029ff;
          case 1:
          case 7:
            pcVar16 = "Penryn";
            goto LAB_001029ff;
          case 4:
          case 8:
switchD_001027ac_caseD_4:
            pcVar16 = "Nehalem";
            goto LAB_001029ff;
          }
        }
        else {
          uVar13 = uVar14;
          if (uVar4 == 0x266) {
            pcVar16 = "Lincroft";
            goto LAB_001029ff;
          }
          if (uVar4 == 0x366) {
            pcVar16 = "Cedarview";
            goto LAB_001029ff;
          }
        }
      }
    }
    else if (uVar4 < 0x306a) {
      uVar4 = uVar4 - 0x2065;
      if (uVar4 < 0xb) {
        uVar13 = 0x481;
        if ((0x481U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar16 = "Westmere";
          goto LAB_001029ff;
        }
        uVar13 = 0x120;
        if ((0x120U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar16 = "SandyBridge";
          goto LAB_001029ff;
        }
        if (uVar4 == 9) goto switchD_001027ac_caseD_4;
      }
    }
    else if (uVar4 < 0x306d) {
      if (uVar4 == 0x306a) {
        pcVar16 = "IvyBridge";
        goto LAB_001029ff;
      }
      if (uVar4 == 0x306c) {
        pcVar16 = "Haswell";
        goto LAB_001029ff;
      }
    }
    else {
      if (uVar4 == 0x306d) {
        pcVar16 = "Broadwell";
        goto LAB_001029ff;
      }
      if (uVar4 == 0x30f1) goto LAB_00102992;
    }
  }
  else if (uVar4 < 0x9067) {
    if (uVar4 < 0x706a) {
      if (uVar4 < 0x606a) {
        if (uVar4 == 0x406c) {
          pcVar16 = "CherryTrail";
          goto LAB_001029ff;
        }
        if (uVar4 == 0x506c) goto LAB_00102932;
        if (uVar4 == 0x506e) {
          pcVar16 = "Skylake";
          goto LAB_001029ff;
        }
      }
      else {
        if (uVar4 == 0x606a) {
LAB_0010293e:
          pcVar16 = "Icelake";
          goto LAB_001029ff;
        }
        if ((uVar4 == 0x60f0) || (uVar4 == 0x60f8)) {
LAB_00102992:
          pcVar16 = "Zen2";
          goto LAB_001029ff;
        }
      }
    }
    else if (uVar4 < 0x806c) {
      if (uVar4 == 0x706a) {
LAB_00102932:
        pcVar16 = "Goldmont";
        goto LAB_001029ff;
      }
      if (uVar4 == 0x706e) goto LAB_0010293e;
      if (uVar4 == 0x70f1) goto LAB_00102992;
    }
    else {
      uVar13 = (ulong)(uVar4 - 0x806c);
      if (uVar4 - 0x806c < 2) {
        pcVar16 = "TigerLake";
        goto LAB_001029ff;
      }
      if (uVar4 == 0x806e) {
LAB_001029a2:
        pcVar16 = "Kabylake";
        goto LAB_001029ff;
      }
    }
  }
  else if (uVar4 < 0xa067) {
    if (uVar4 < 0x90f0) {
      if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
        pcVar16 = "Alderlake";
        goto LAB_001029ff;
      }
      if (uVar4 == 0x906e) goto LAB_001029a2;
    }
    else {
      uVar13 = (ulong)(uVar4 - 0xa065);
      if (uVar4 - 0xa065 < 2) {
        pcVar16 = "Cometlake";
        goto LAB_001029ff;
      }
      if (uVar4 == 0x90f0) goto LAB_00102992;
    }
  }
  else if (uVar4 < 0x40f40) {
    if (uVar4 == 0xa067) {
      pcVar16 = "Rocketlake";
      goto LAB_001029ff;
    }
    if (uVar4 == 0xb067) {
      pcVar16 = "Raptorlake";
      goto LAB_001029ff;
    }
    if (uVar4 == 0x20f10) goto LAB_0010294a;
  }
  else {
    if (uVar4 == 0x40f40) {
      pcVar16 = "Zen3+";
      goto LAB_001029ff;
    }
    if (uVar4 == 0x50f00) {
LAB_0010294a:
      pcVar16 = "Zen3";
      goto LAB_001029ff;
    }
    if (uVar4 == 0x60f10) {
      pcVar16 = "Zen4";
      goto LAB_001029ff;
    }
  }
  pcVar16 = "unknown";
LAB_001029ff:
  printf("x64 processor:  %s\t",pcVar16,(ulong)puVar1[2],uVar13);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar2 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar2 + 0xc) != '@') {
    lVar2 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar2 + 0xc),(ulong)*(uint *)(lVar2 + 8),
           (ulong)*(uint *)(lVar2 + 0xc));
  }
  r = roaring_bitmap_create_with_capacity(0);
  uVar15 = 100;
  do {
    roaring_bitmap_add(r,uVar15);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 1000);
  _Var3 = roaring_bitmap_contains(r,500);
  _assert_true((ulong)_Var3,"roaring_bitmap_contains(r1, 500)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
               ,0x16);
  uVar5 = roaring_bitmap_get_cardinality(r);
  printf("Cardinality = %d \n",uVar5 & 0xffffffff);
  sVar6 = roaring_bitmap_portable_size_in_bytes(r);
  roaring_bitmap_run_optimize(r);
  sVar7 = roaring_bitmap_portable_size_in_bytes(r);
  printf("size before run optimize %d bytes, and after %d bytes\n",sVar6 & 0xffffffff,
         sVar7 & 0xffffffff);
  local_448 = 0x600000005;
  local_458 = 0x100000000;
  uStack_450 = 0x300000002;
  prVar8 = roaring_bitmap_of_ptr(5,(uint32_t *)((long)&local_458 + 4));
  roaring_bitmap_printf(prVar8);
  local_488[0] = 2;
  local_488[1] = 3;
  local_488[2] = 4;
  prVar9 = roaring_bitmap_of_ptr(3,local_488);
  uVar5 = roaring_bitmap_get_cardinality(r);
  puVar10 = (uint32_t *)malloc(uVar5 * 4);
  _assert_true((ulong)(puVar10 != (uint32_t *)0x0),"arr1 != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
               ,0x2d);
  roaring_bitmap_to_uint32_array(r,puVar10);
  prVar11 = roaring_bitmap_of_ptr(uVar5,puVar10);
  free(puVar10);
  _Var3 = roaring_bitmap_equals(r,prVar11);
  _assert_true((ulong)_Var3,"roaring_bitmap_equals(r1, r1f)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
               ,0x31);
  roaring_bitmap_free(prVar11);
  puVar10 = (uint32_t *)malloc(4000);
  _assert_true((ulong)(puVar10 != (uint32_t *)0x0),"arr3 != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
               ,0x38);
  roaring_bitmap_range_uint32_array(r,100,1000,puVar10);
  free(puVar10);
  prVar11 = roaring_bitmap_copy(prVar9);
  _Var3 = roaring_bitmap_equals(prVar9,prVar11);
  _assert_true((ulong)_Var3,"roaring_bitmap_equals(r3, z)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
               ,0x3e);
  roaring_bitmap_free(prVar11);
  prVar11 = roaring_bitmap_or(r,prVar8);
  roaring_bitmap_or_inplace(prVar11,prVar9);
  local_4a8 = prVar9;
  local_478 = r;
  local_470 = prVar8;
  local_468 = prVar9;
  prVar9 = roaring_bitmap_or_many(3,&local_478);
  _Var3 = roaring_bitmap_equals(prVar11,prVar9);
  _assert_true((ulong)_Var3,"roaring_bitmap_equals(r1_2_3, bigunion)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
               ,0x49);
  r2 = roaring_bitmap_or_many_heap(3,&local_478);
  _Var3 = roaring_bitmap_equals(prVar11,r2);
  _assert_true((ulong)_Var3,"roaring_bitmap_equals(r1_2_3, bigunionheap)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
               ,0x4d);
  roaring_bitmap_free(prVar11);
  roaring_bitmap_free(prVar9);
  roaring_bitmap_free(r2);
  local_4a0 = prVar8;
  prVar8 = roaring_bitmap_and(r,prVar8);
  roaring_bitmap_free(prVar8);
  sVar6 = roaring_bitmap_portable_size_in_bytes(r);
  uVar13 = sVar6 & 0xffffffff;
  pcVar16 = (char *)malloc(uVar13);
  roaring_bitmap_portable_serialize(r,pcVar16);
  prVar8 = roaring_bitmap_portable_deserialize_safe(pcVar16,uVar13);
  if (prVar8 != (roaring_bitmap_t *)0x0) {
    local_490 = (char *)0x0;
    _Var3 = roaring_bitmap_internal_validate(prVar8,&local_490);
    if (!_Var3) {
      return 1;
    }
    _Var3 = roaring_bitmap_equals(r,prVar8);
    _assert_true((ulong)_Var3,"roaring_bitmap_equals(r1, t)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,100);
    roaring_bitmap_free(prVar8);
    sVar6 = roaring_bitmap_portable_deserialize_size(pcVar16,uVar13);
    printf("\nsizeofbitmap = %zu \n",sVar6);
    _assert_true((ulong)(sVar6 == uVar13),"sizeofbitmap == expectedsize",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                 ,0x6d);
    prVar8 = roaring_bitmap_portable_deserialize_safe(pcVar16,uVar13);
    if (prVar8 == (roaring_bitmap_t *)0x0) {
      puts("Problem during deserialization.");
      return 1;
    }
    local_498 = (char *)0x0;
    _Var3 = roaring_bitmap_internal_validate(prVar8,&local_498);
    if (_Var3) {
      _Var3 = roaring_bitmap_equals(r,prVar8);
      _assert_true((ulong)_Var3,"roaring_bitmap_equals(r1, t)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/c_example1.c"
                   ,0x7c);
      roaring_bitmap_free(prVar8);
      free(pcVar16);
      local_4ac = 0;
      roaring_iterate(r,roaring_iterator_sumall,&local_4ac);
      local_4ac = 0;
      prVar12 = roaring_iterator_create(r);
      if (prVar12->has_value == true) {
        do {
          local_4ac = local_4ac + 1;
          roaring_uint32_iterator_advance(prVar12);
        } while (prVar12->has_value != false);
      }
      roaring_uint32_iterator_free(prVar12);
      prVar12 = roaring_iterator_create(r);
      do {
        uVar15 = roaring_uint32_iterator_read(prVar12,local_438,0x100);
        if (uVar15 != 0) {
          uVar13 = 0;
          do {
            local_4ac = local_4ac + local_438[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar15 != uVar13);
        }
      } while (0xff < uVar15);
      roaring_uint32_iterator_free(prVar12);
      roaring_bitmap_free(r);
      roaring_bitmap_free(local_4a0);
      roaring_bitmap_free(local_4a8);
      puts("Success.");
      return 0;
    }
    printf("safely deserialized invalid bitmap: %s\n",local_498);
  }
  return 1;
}

Assistant:

int main() {
    tellmeall();
    // create a new empty bitmap
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) roaring_bitmap_add(r1, i);
    // check whether a value is contained
    assert_true(roaring_bitmap_contains(r1, 500));
    // compute how many bits there are:
    uint32_t cardinality = roaring_bitmap_get_cardinality(r1);
    printf("Cardinality = %d \n", cardinality);

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    uint32_t expectedsizebasic = roaring_bitmap_portable_size_in_bytes(r1);
    roaring_bitmap_run_optimize(r1);
    uint32_t expectedsizerun = roaring_bitmap_portable_size_in_bytes(r1);
    printf("size before run optimize %d bytes, and after %d bytes\n",
           expectedsizebasic, expectedsizerun);
    // create a new bitmap containing the values {1,2,3,5,6}
    roaring_bitmap_t *r2 = roaring_bitmap_from(1, 2, 3, 5, 6);
    roaring_bitmap_printf(r2);  // print it

    // we can also create a bitmap from a pointer to 32-bit integers
    uint32_t somevalues[] = {2, 3, 4};
    roaring_bitmap_t *r3 = roaring_bitmap_of_ptr(3, somevalues);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_true(arr1 != NULL);
    roaring_bitmap_to_uint32_array(r1, arr1);
    roaring_bitmap_t *r1f = roaring_bitmap_of_ptr(card1, arr1);
    free(arr1);
    assert_true(roaring_bitmap_equals(r1, r1f));  // what we recover is equal
    roaring_bitmap_free(r1f);

    // we can go from arrays to bitmaps from "offset" by "limit"
    size_t offset = 100;
    size_t limit = 1000;
    uint32_t *arr3 = (uint32_t *)malloc(limit * sizeof(uint32_t));
    assert_true(arr3 != NULL);
    roaring_bitmap_range_uint32_array(r1, offset, limit, arr3);
    free(arr3);

    // we can copy and compare bitmaps
    roaring_bitmap_t *z = roaring_bitmap_copy(r3);
    assert_true(roaring_bitmap_equals(r3, z));  // what we recover is equal
    roaring_bitmap_free(z);

    // we can compute union two-by-two
    roaring_bitmap_t *r1_2_3 = roaring_bitmap_or(r1, r2);
    roaring_bitmap_or_inplace(r1_2_3, r3);

    // we can compute a big union
    const roaring_bitmap_t *allmybitmaps[] = {r1, r2, r3};
    roaring_bitmap_t *bigunion = roaring_bitmap_or_many(3, allmybitmaps);
    assert_true(
        roaring_bitmap_equals(r1_2_3, bigunion));  // what we recover is equal
    // can also do the big union with a heap
    roaring_bitmap_t *bigunionheap =
        roaring_bitmap_or_many_heap(3, allmybitmaps);
    assert_true(roaring_bitmap_equals(r1_2_3, bigunionheap));

    roaring_bitmap_free(r1_2_3);
    roaring_bitmap_free(bigunion);
    roaring_bitmap_free(bigunionheap);

    // we can compute intersection two-by-two
    roaring_bitmap_t *i1_2 = roaring_bitmap_and(r1, r2);
    roaring_bitmap_free(i1_2);

    // we can write a bitmap to a pointer and recover it later
    uint32_t expectedsize = roaring_bitmap_portable_size_in_bytes(r1);
    char *serializedbytes = (char *)malloc(expectedsize);
    roaring_bitmap_portable_serialize(r1, serializedbytes);
    roaring_bitmap_t *t =
        roaring_bitmap_portable_deserialize_safe(serializedbytes, expectedsize);
    if (t == NULL) {
        return EXIT_FAILURE;
    }
    const char *reason = NULL;
    if (!roaring_bitmap_internal_validate(t, &reason)) {
        return EXIT_FAILURE;
    }
    assert_true(roaring_bitmap_equals(r1, t));  // what we recover is equal
    roaring_bitmap_free(t);
    // we can also check whether there is a bitmap at a memory location without
    // reading it
    size_t sizeofbitmap =
        roaring_bitmap_portable_deserialize_size(serializedbytes, expectedsize);
    printf("\nsizeofbitmap = %zu \n", sizeofbitmap);
    assert_true(
        sizeofbitmap ==
        expectedsize);  // sizeofbitmap would be zero if no bitmap were found
    // we can also read the bitmap "safely" by specifying a byte size limit:
    t = roaring_bitmap_portable_deserialize_safe(serializedbytes, expectedsize);
    if (t == NULL) {
        printf("Problem during deserialization.\n");
        // We could clear any memory and close any file here.
        return EXIT_FAILURE;
    }
    // We can validate the bitmap we recovered to make sure it is proper.
    const char *reason_failure = NULL;
    if (!roaring_bitmap_internal_validate(t, &reason_failure)) {
        printf("safely deserialized invalid bitmap: %s\n", reason_failure);
        // We could clear any memory and close any file here.
        return EXIT_FAILURE;
    }
    assert_true(roaring_bitmap_equals(r1, t));  // what we recover is equal
    roaring_bitmap_free(t);

    free(serializedbytes);

    // we can iterate over all values using custom functions
    uint32_t counter = 0;
    roaring_iterate(r1, roaring_iterator_sumall, &counter);

    // we can also create iterator structs
    counter = 0;
    roaring_uint32_iterator_t *i = roaring_iterator_create(r1);
    while (i->has_value) {
        counter++;  // could use    i->current_value
        roaring_uint32_iterator_advance(i);
    }
    // you can skip over values and move the iterator with
    // roaring_uint32_iterator_move_equalorlarger(i,someintvalue)

    roaring_uint32_iterator_free(i);
    // roaring_bitmap_get_cardinality(r1) == counter

    // for greater speed, you can iterate over the data in bulk
    i = roaring_iterator_create(r1);
    uint32_t buffer[256];
    while (1) {
        uint32_t ret = roaring_uint32_iterator_read(i, buffer, 256);
        for (uint32_t j = 0; j < ret; j++) {
            counter += buffer[j];
        }
        if (ret < 256) {
            break;
        }
    }
    roaring_uint32_iterator_free(i);

    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r3);
    printf("Success.\n");
    return EXIT_SUCCESS;
}